

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::GeneratedCodeInfo::_InternalParse
          (GeneratedCodeInfo *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined1 auVar4 [12];
  char *ptr_00;
  Rep *pRVar5;
  GeneratedCodeInfo_Annotation *msg;
  uint32 res;
  uint tag;
  int iVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_bool> pVar8;
  
  do {
    while( true ) {
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
            (long)(ctx->super_EpsCopyInputStream).limit_) {
          return (char *)(byte *)ptr;
        }
        pVar8 = internal::EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
        ptr = pVar8.first;
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          return (char *)(byte *)ptr;
        }
      }
      bVar1 = *ptr;
      auVar4[8] = bVar1;
      auVar4._0_8_ = (byte *)ptr + 1;
      auVar4._9_3_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = ((byte *)ptr)[1];
        res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar7 = internal::ReadTagFallback(ptr,res);
          auVar4 = pVar7._0_12_;
          if (pVar7.first == (char *)0x0) {
            return (char *)0x0;
          }
        }
        else {
          auVar4._8_4_ = res;
          auVar4._0_8_ = (byte *)ptr + 2;
        }
      }
      ptr_00 = auVar4._0_8_;
      tag = auVar4._8_4_;
      if (tag == 10) break;
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        return ptr_00;
      }
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr_00,ctx);
      if ((byte *)ptr == (byte *)0x0) {
        return (char *)0x0;
      }
    }
    ptr = ptr_00 + -1;
    do {
      pRVar5 = (this->annotation_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar5 == (Rep *)0x0) {
        iVar6 = (this->annotation_).super_RepeatedPtrFieldBase.total_size_;
LAB_00175898:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(this->annotation_).super_RepeatedPtrFieldBase,iVar6 + 1);
        pRVar5 = (this->annotation_).super_RepeatedPtrFieldBase.rep_;
        iVar6 = pRVar5->allocated_size;
LAB_001758a8:
        pRVar5->allocated_size = iVar6 + 1;
        msg = Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo_Annotation>
                        ((this->annotation_).super_RepeatedPtrFieldBase.arena_);
        pRVar5 = (this->annotation_).super_RepeatedPtrFieldBase.rep_;
        iVar6 = (this->annotation_).super_RepeatedPtrFieldBase.current_size_;
        (this->annotation_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
        pRVar5->elements[iVar6] = msg;
      }
      else {
        iVar3 = (this->annotation_).super_RepeatedPtrFieldBase.current_size_;
        iVar6 = pRVar5->allocated_size;
        if (iVar6 <= iVar3) {
          if (iVar6 == (this->annotation_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_00175898;
          goto LAB_001758a8;
        }
        (this->annotation_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        msg = (GeneratedCodeInfo_Annotation *)pRVar5->elements[iVar3];
      }
      ptr = internal::ParseContext::ParseMessage<google::protobuf::GeneratedCodeInfo_Annotation>
                      (ctx,msg,(char *)((byte *)ptr + 1));
      if ((byte *)ptr == (byte *)0x0) {
        return (char *)0x0;
      }
    } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 10));
  } while( true );
}

Assistant:

const char* GeneratedCodeInfo::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_annotation(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}